

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_profile.c
# Opt level: O2

parasail_profile_t *
parasail_profile_create_stats_32_dispatcher(char *s1,int s1Len,parasail_matrix_t *matrix)

{
  int iVar1;
  parasail_profile_t *ppVar2;
  code *UNRECOVERED_JUMPTABLE;
  
  iVar1 = parasail_can_use_avx2();
  if (iVar1 == 0) {
    iVar1 = parasail_can_use_sse41();
    UNRECOVERED_JUMPTABLE = parasail_profile_create_stats_sse_128_32;
    if (iVar1 == 0) {
      iVar1 = parasail_can_use_sse2();
      UNRECOVERED_JUMPTABLE = parasail_profile_create_stats_sse_128_32;
      if (iVar1 == 0) {
        return (parasail_profile_t *)0x0;
      }
    }
  }
  else {
    UNRECOVERED_JUMPTABLE = parasail_profile_create_stats_avx_256_32;
  }
  parasail_profile_create_stats_32_pointer = UNRECOVERED_JUMPTABLE;
  ppVar2 = (*UNRECOVERED_JUMPTABLE)(s1,s1Len,matrix);
  return ppVar2;
}

Assistant:

parasail_profile_t* parasail_profile_create_stats_32_dispatcher(
        const char * const restrict s1, const int s1Len,
        const parasail_matrix_t *matrix)
{
#if HAVE_AVX2
    if (parasail_can_use_avx2()) {
        parasail_profile_create_stats_32_pointer = parasail_profile_create_stats_avx_256_32;
    }
    else
#endif
#if HAVE_SSE41
    if (parasail_can_use_sse41()) {
        parasail_profile_create_stats_32_pointer = parasail_profile_create_stats_sse_128_32;
    }
    else
#endif
#if HAVE_SSE2
    if (parasail_can_use_sse2()) {
        parasail_profile_create_stats_32_pointer = parasail_profile_create_stats_sse_128_32;
    }
    else
#endif
#if HAVE_ALTIVEC
    if (parasail_can_use_altivec()) {
        parasail_profile_create_stats_32_pointer = parasail_profile_create_stats_altivec_128_32;
    }
    else
#endif
#if HAVE_NEON
    if (parasail_can_use_neon()) {
        parasail_profile_create_stats_32_pointer = parasail_profile_create_stats_neon_128_32;
    }
    else
#endif
    {
        /* no fallback; caller must check for non-NULL profile */
        return NULL;
    }
    return parasail_profile_create_stats_32_pointer(s1, s1Len, matrix);
}